

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

fields absl::lts_20240722::time_internal::cctz::detail::impl::n_day
                 (year_t y,month_t m,diff_t d,diff_t cd,hour_t hh,minute_t mm,second_t ss)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  int yi;
  ulong uVar11;
  fields fVar12;
  
  lVar6 = cd % 0x23ab1;
  lVar3 = (cd / 0x23ab1) * 400;
  lVar9 = lVar3 + -400;
  if (-1 < lVar6) {
    lVar9 = lVar3;
  }
  lVar3 = lVar6 + 0x23ab1;
  if (-1 < lVar6) {
    lVar3 = lVar6;
  }
  lVar9 = (d / 0x23ab1) * 400 + lVar9 + y % 400;
  uVar10 = d % 0x23ab1 + lVar3;
  if (uVar10 == 0 || SCARRY8(d % 0x23ab1,lVar3) != (long)uVar10 < 0) {
    if ((long)uVar10 < -0x16c) {
      lVar9 = lVar9 + -400;
      uVar10 = uVar10 + 0x23ab1;
    }
    else {
      lVar9 = lVar9 + -1;
      iVar2 = days_per_year(lVar9,m);
      uVar10 = uVar10 + (long)iVar2;
    }
  }
  else if (0x23ab1 < uVar10) {
    lVar9 = lVar9 + 400;
    uVar10 = uVar10 - 0x23ab1;
  }
  if (0x16d < (long)uVar10) {
    uVar7 = (long)((ulong)('\x02' < m) + lVar9) % 400;
    uVar11 = (ulong)((int)uVar7 + 400);
    if (-1 < (long)uVar7) {
      uVar11 = uVar7 & 0xffffffff;
    }
    while( true ) {
      iVar2 = (int)uVar11;
      uVar4 = (ulong)(300 < iVar2 || iVar2 == 0) | 0x8eac;
      uVar7 = uVar10 - uVar4;
      if (uVar7 == 0 || (long)uVar10 < (long)uVar4) break;
      lVar9 = lVar9 + 100;
      uVar5 = iVar2 - 300;
      if (iVar2 < 300) {
        uVar5 = iVar2 + 100;
      }
      uVar11 = (ulong)uVar5;
      uVar10 = uVar7;
    }
    while( true ) {
      yi = (int)uVar11;
      iVar2 = days_per_4years(yi);
      uVar4 = uVar10 - (long)iVar2;
      lVar3 = lVar9;
      uVar7 = uVar10;
      if (uVar4 == 0 || (long)uVar10 < (long)iVar2) break;
      lVar9 = lVar9 + 4;
      uVar5 = yi - 0x18c;
      if (yi < 0x18c) {
        uVar5 = yi + 4;
      }
      uVar11 = (ulong)uVar5;
      uVar10 = uVar4;
    }
    do {
      uVar10 = uVar7;
      lVar9 = lVar3;
      iVar2 = days_per_year(lVar9,m);
      uVar7 = uVar10 - (long)iVar2;
      lVar3 = lVar9 + 1;
    } while (uVar7 != 0 && (long)iVar2 <= (long)uVar10);
  }
  if (0x1c < (long)uVar10) {
    while( true ) {
      iVar2 = days_per_month(lVar9,m);
      uVar7 = uVar10 - (long)iVar2;
      if (uVar7 == 0 || (long)uVar10 < (long)iVar2) break;
      bVar8 = m + 1;
      cVar1 = m - 0xc;
      m = bVar8;
      if (SBORROW1(bVar8,'\r') == cVar1 < '\0') {
        m = 1;
      }
      lVar9 = lVar9 + (ulong)('\f' < (char)bVar8);
      uVar10 = uVar7;
    }
  }
  fVar12._8_8_ = (ulong)(byte)m |
                 (ulong)(((uint)uVar10 & 0xff) << 8) |
                 (ulong)(byte)hh << 0x10 | (ulong)(byte)mm << 0x18 | (ulong)(byte)ss << 0x20;
  fVar12.y = (y - y % 400) + lVar9;
  return fVar12;
}

Assistant:

CONSTEXPR_F fields n_day(year_t y, month_t m, diff_t d, diff_t cd, hour_t hh,
                         minute_t mm, second_t ss) noexcept {
  year_t ey = y % 400;
  const year_t oey = ey;
  ey += (cd / 146097) * 400;
  cd %= 146097;
  if (cd < 0) {
    ey -= 400;
    cd += 146097;
  }
  ey += (d / 146097) * 400;
  d = d % 146097 + cd;
  if (d > 0) {
    if (d > 146097) {
      ey += 400;
      d -= 146097;
    }
  } else {
    if (d > -365) {
      // We often hit the previous year when stepping a civil time backwards,
      // so special case it to avoid counting up by 100/4/1-year chunks.
      ey -= 1;
      d += days_per_year(ey, m);
    } else {
      ey -= 400;
      d += 146097;
    }
  }
  if (d > 365) {
    int yi = year_index(ey, m);  // Index into Gregorian 400 year cycle.
    for (;;) {
      int n = days_per_century(yi);
      if (d <= n) break;
      d -= n;
      ey += 100;
      yi += 100;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_4years(yi);
      if (d <= n) break;
      d -= n;
      ey += 4;
      yi += 4;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_year(ey, m);
      if (d <= n) break;
      d -= n;
      ++ey;
    }
  }
  if (d > 28) {
    for (;;) {
      int n = days_per_month(ey, m);
      if (d <= n) break;
      d -= n;
      if (++m > 12) {
        ++ey;
        m = 1;
      }
    }
  }
  return fields(y + (ey - oey), m, static_cast<day_t>(d), hh, mm, ss);
}